

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBrVar(WatWriter *this,Var *var,NextChar next_char)

{
  uint uVar1;
  uint uVar2;
  
  if (var->type_ == Name) {
    WritePuts(this,(var->field_2).name_._M_dataplus._M_p,next_char);
    return;
  }
  if (var->type_ == Index) {
    uVar1 = (var->field_2).index_;
    uVar2 = (int)((ulong)((long)(this->super_ModuleContext).label_stack_.
                                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ModuleContext).label_stack_.
                               super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) * -0x45d1745d;
    if (uVar1 < uVar2) {
      Writef(this,"%u (;@%u;)",(ulong)uVar1,(ulong)(uVar2 + ~uVar1));
    }
    else {
      Writef(this,"%u (; INVALID ;)");
    }
    this->next_char_ = next_char;
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3e,"const std::string &wabt::Var::name() const");
}

Assistant:

void WatWriter::WriteBrVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    if (var.index() < GetLabelStackSize()) {
      Writef("%" PRIindex " (;@%" PRIindex ";)", var.index(),
             GetLabelStackSize() - var.index() - 1);
    } else {
      Writef("%" PRIindex " (; INVALID ;)", var.index());
    }
    next_char_ = next_char;
  } else {
    WriteString(var.name(), next_char);
  }
}